

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge-segments.cpp
# Opt level: O0

void __thiscall
msdfgen::EdgeSegment::distanceToPseudoDistance
          (EdgeSegment *this,SignedDistance *distance,Point2 origin,double param)

{
  double dVar1;
  double pseudoDistance_1;
  double ts_1;
  double local_b8;
  undefined1 local_b0 [8];
  Vector2 bq;
  undefined1 local_90 [8];
  Vector2 dir_1;
  double pseudoDistance;
  double ts;
  double local_68;
  undefined1 local_60 [8];
  Vector2 aq;
  undefined1 local_40 [8];
  Vector2 dir;
  double param_local;
  SignedDistance *distance_local;
  EdgeSegment *this_local;
  Point2 origin_local;
  
  origin_local.x = origin.y;
  this_local = (EdgeSegment *)origin.x;
  dir.y = param;
  if (0.0 <= param) {
    if (1.0 < param) {
      (*this->_vptr_EdgeSegment[4])(0x3ff0000000000000);
      _local_90 = Vector2::normalize((Vector2 *)&bq.y,false);
      dVar1 = local_90._8_8_;
      (*this->_vptr_EdgeSegment[3])(0x3ff0000000000000);
      local_b8 = dVar1;
      _local_b0 = Vector2::operator-((Vector2 *)&this_local,(Vector2 *)&ts_1);
      dVar1 = dotProduct((Vector2 *)local_b0,(Vector2 *)local_90);
      if ((0.0 < dVar1) &&
         (dVar1 = crossProduct((Vector2 *)local_b0,(Vector2 *)local_90),
         ABS(dVar1) <= ABS(distance->distance))) {
        distance->distance = dVar1;
        distance->dot = 0.0;
      }
    }
  }
  else {
    (*this->_vptr_EdgeSegment[4])();
    _local_40 = Vector2::normalize((Vector2 *)&aq.y,false);
    dVar1 = local_40._8_8_;
    (*this->_vptr_EdgeSegment[3])();
    local_68 = dVar1;
    _local_60 = Vector2::operator-((Vector2 *)&this_local,(Vector2 *)&ts);
    dVar1 = dotProduct((Vector2 *)local_60,(Vector2 *)local_40);
    if ((dVar1 < 0.0) &&
       (dVar1 = crossProduct((Vector2 *)local_60,(Vector2 *)local_40),
       ABS(dVar1) <= ABS(distance->distance))) {
      distance->distance = dVar1;
      distance->dot = 0.0;
    }
  }
  return;
}

Assistant:

void EdgeSegment::distanceToPseudoDistance(SignedDistance &distance, Point2 origin, double param) const {
    if (param < 0) {
        Vector2 dir = direction(0).normalize();
        Vector2 aq = origin-point(0);
        double ts = dotProduct(aq, dir);
        if (ts < 0) {
            double pseudoDistance = crossProduct(aq, dir);
            if (fabs(pseudoDistance) <= fabs(distance.distance)) {
                distance.distance = pseudoDistance;
                distance.dot = 0;
            }
        }
    } else if (param > 1) {
        Vector2 dir = direction(1).normalize();
        Vector2 bq = origin-point(1);
        double ts = dotProduct(bq, dir);
        if (ts > 0) {
            double pseudoDistance = crossProduct(bq, dir);
            if (fabs(pseudoDistance) <= fabs(distance.distance)) {
                distance.distance = pseudoDistance;
                distance.dot = 0;
            }
        }
    }
}